

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

uint32 * rw::ps2::instanceNormal(uint32 *wp,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  ushort uVar1;
  V3d *pVVar2;
  ulong uVar3;
  uint32 *puVar4;
  uint uVar5;
  
  uVar5 = n + idx;
  if ((g->flags & 0x10) == 0) {
    for (; puVar4 = wp, idx < uVar5; idx = idx + 1) {
      *(undefined2 *)wp = 0;
      *(undefined1 *)((long)wp + 2) = 0;
      wp = (uint32 *)((long)wp + 3);
    }
  }
  else {
    pVVar2 = g->morphTargets->normals;
    for (uVar3 = (ulong)idx; puVar4 = wp, uVar3 < uVar5; uVar3 = uVar3 + 1) {
      uVar1 = m->indices[uVar3];
      *(char *)wp = (char)(int)((float)pVVar2[uVar1].x * 127.0);
      *(char *)((long)wp + 1) = (char)(int)((float)pVVar2[uVar1].y * 127.0);
      *(char *)((long)wp + 2) = (char)(int)((float)pVVar2[uVar1].z * 127.0);
      wp = (uint32 *)((long)wp + 3);
    }
  }
  for (; ((ulong)puVar4 & 0xf) != 0; puVar4 = (uint32 *)((long)puVar4 + 1)) {
    *(undefined1 *)wp = 0;
    wp = (uint32 *)((long)wp + 1);
  }
  return wp;
}

Assistant:

uint32*
instanceNormal(uint32 *wp, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	V3d *d = g->morphTargets[0].normals;
	uint8 *p = (uint8*)wp;
	if((g->flags & Geometry::NORMALS))
		for(uint32 i = idx; i < idx+n; i++){
			j = m->indices[i];
			*p++ = d[j].x*127.0f;
			*p++ = d[j].y*127.0f;
			*p++ = d[j].z*127.0f;
		}
	else
		for(uint32 i = idx; i < idx+n; i++){
			*p++ = 0;
			*p++ = 0;
			*p++ = 0;
		}
	while((uintptr)p % 0x10)
		*p++ = 0;
	return (uint32*)p;
}